

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_graphics_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkGraphicsPipelineCreateInfo **out_create_info)

{
  uint uVar1;
  VkPipelineDynamicStateCreateInfo *pVVar2;
  int *piVar3;
  VkPipelineColorBlendStateCreateInfo *pVVar4;
  VkPipelineColorBlendAttachmentState *__src;
  VkPipelineVertexInputStateCreateInfo *pVVar5;
  VkVertexInputAttributeDescription *__src_00;
  VkVertexInputBindingDescription *__src_01;
  VkPipelineViewportStateCreateInfo *pVVar6;
  VkViewport *__src_02;
  VkRect2D *__src_03;
  VkPipelineMultisampleStateCreateInfo *pVVar7;
  VkSampleMask *__src_04;
  undefined8 uVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  VkGraphicsPipelineCreateInfo *info;
  ulong uVar12;
  VkPipelineColorBlendAttachmentState *__dest;
  VkVertexInputAttributeDescription *__dest_00;
  VkVertexInputBindingDescription *__dest_01;
  VkViewport *__dest_02;
  VkRect2D *__dest_03;
  VkSampleMask *__dest_04;
  byte bVar13;
  int *piVar14;
  VkPipelineColorBlendStateCreateInfo *blend;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkPipelineViewportStateCreateInfo *vp;
  size_t sVar15;
  long *in_FS_OFFSET;
  GlobalStateInfo GVar16;
  DynamicStateInfo dynamic_info;
  DynamicStateInfo local_d8;
  VkPipelineViewportStateCreateInfo **local_90;
  VkPipelineMultisampleStateCreateInfo **local_88;
  VkPipelineVertexInputStateCreateInfo **local_80;
  VkDevice local_78;
  DynamicStateInfo local_70;
  
  local_78 = device;
  info = (VkGraphicsPipelineCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x90,0x10);
  if (info != (VkGraphicsPipelineCreateInfo *)0x0) {
    memmove(info,create_info,0x90);
  }
  local_d8.color_blend_advanced = false;
  local_d8.provoking_vertex_mode = false;
  local_d8.line_rasterization_mode = false;
  local_d8.line_stipple_enable = false;
  local_d8.depth_clip_negative_one_to_one = false;
  local_d8.viewport_w_scaling_enable = false;
  local_d8.viewport_swizzle = false;
  local_d8.coverage_to_color_enable = false;
  local_d8.coverage_to_color_location = false;
  local_d8.coverage_modulation_mode = false;
  local_d8.coverage_modulation_table_enable = false;
  local_d8.coverage_modulation_table = false;
  local_d8.shading_rate_image_enable = false;
  local_d8.representative_fragment_test_enable = false;
  local_d8.coverage_reduction_mode = false;
  local_d8.depth_clamp_range = false;
  local_d8.tessellation_domain_origin = false;
  local_d8.depth_clamp_enable = false;
  local_d8.polygon_mode = false;
  local_d8.rasterization_samples = false;
  local_d8.sample_mask = false;
  local_d8.alpha_to_coverage_enable = false;
  local_d8.alpha_to_one_enable = false;
  local_d8.logic_op_enable = false;
  local_d8.color_blend_enable = false;
  local_d8.color_blend_equation = false;
  local_d8.color_write_mask = false;
  local_d8.rasterization_stream = false;
  local_d8.conservative_rasterization_mode = false;
  local_d8.extra_primitive_overestimation_size = false;
  local_d8.depth_clip_enable = false;
  local_d8.sample_locations_enable = false;
  local_d8.depth_bounds_test_enable = false;
  local_d8.stencil_test_enable = false;
  local_d8.stencil_op = false;
  local_d8.vertex_input = false;
  local_d8.vertex_input_binding_stride = false;
  local_d8.patch_control_points = false;
  local_d8.rasterizer_discard_enable = false;
  local_d8.primitive_restart_enable = false;
  local_d8.logic_op = false;
  local_d8.color_write_enable = false;
  local_d8.depth_bias_enable = false;
  local_d8.discard_rectangle = false;
  local_d8.discard_rectangle_mode = false;
  local_d8.fragment_shading_rate = false;
  local_d8.sample_locations = false;
  local_d8.line_stipple = false;
  local_d8.stencil_compare = false;
  local_d8.stencil_reference = false;
  local_d8.stencil_write_mask = false;
  local_d8.depth_bounds = false;
  local_d8.depth_bias = false;
  local_d8.line_width = false;
  local_d8.blend_constants = false;
  local_d8.scissor = false;
  local_d8.viewport = false;
  local_d8.scissor_count = false;
  local_d8.viewport_count = false;
  local_d8.cull_mode = false;
  local_d8.front_face = false;
  local_d8.depth_test_enable = false;
  local_d8.depth_write_enable = false;
  local_d8.depth_compare_op = false;
  pVVar2 = create_info->pDynamicState;
  if (pVVar2 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    bVar9 = 0;
    bVar13 = 0;
  }
  else {
    Hashing::parse_dynamic_state_info
              (&local_70,(Hashing *)(ulong)pVVar2->dynamicStateCount,
               (VkPipelineDynamicStateCreateInfo *)pVVar2->pDynamicStates);
    local_d8.color_blend_advanced = local_70.color_blend_advanced;
    local_d8.provoking_vertex_mode = local_70.provoking_vertex_mode;
    local_d8.line_rasterization_mode = local_70.line_rasterization_mode;
    local_d8.line_stipple_enable = local_70.line_stipple_enable;
    local_d8.depth_clip_negative_one_to_one = local_70.depth_clip_negative_one_to_one;
    local_d8.viewport_w_scaling_enable = local_70.viewport_w_scaling_enable;
    local_d8.viewport_swizzle = local_70.viewport_swizzle;
    local_d8.coverage_to_color_enable = local_70.coverage_to_color_enable;
    local_d8.coverage_to_color_location = local_70.coverage_to_color_location;
    local_d8.coverage_modulation_mode = local_70.coverage_modulation_mode;
    local_d8.coverage_modulation_table_enable = local_70.coverage_modulation_table_enable;
    local_d8.coverage_modulation_table = local_70.coverage_modulation_table;
    local_d8.shading_rate_image_enable = local_70.shading_rate_image_enable;
    local_d8.representative_fragment_test_enable = local_70.representative_fragment_test_enable;
    local_d8.coverage_reduction_mode = local_70.coverage_reduction_mode;
    local_d8.depth_clamp_range = local_70.depth_clamp_range;
    local_d8.tessellation_domain_origin = local_70.tessellation_domain_origin;
    local_d8.depth_clamp_enable = local_70.depth_clamp_enable;
    local_d8.polygon_mode = local_70.polygon_mode;
    local_d8.rasterization_samples = local_70.rasterization_samples;
    local_d8.sample_mask = local_70.sample_mask;
    local_d8.alpha_to_coverage_enable = local_70.alpha_to_coverage_enable;
    local_d8.alpha_to_one_enable = local_70.alpha_to_one_enable;
    local_d8.logic_op_enable = local_70.logic_op_enable;
    local_d8.color_blend_enable = local_70.color_blend_enable;
    local_d8.color_blend_equation = local_70.color_blend_equation;
    local_d8.color_write_mask = local_70.color_write_mask;
    local_d8.rasterization_stream = local_70.rasterization_stream;
    local_d8.conservative_rasterization_mode = local_70.conservative_rasterization_mode;
    local_d8.extra_primitive_overestimation_size = local_70.extra_primitive_overestimation_size;
    local_d8.depth_clip_enable = local_70.depth_clip_enable;
    local_d8.sample_locations_enable = local_70.sample_locations_enable;
    local_d8.depth_bounds_test_enable = local_70.depth_bounds_test_enable;
    local_d8.stencil_test_enable = local_70.stencil_test_enable;
    local_d8.stencil_op = local_70.stencil_op;
    local_d8.vertex_input = local_70.vertex_input;
    local_d8.vertex_input_binding_stride = local_70.vertex_input_binding_stride;
    local_d8.patch_control_points = local_70.patch_control_points;
    local_d8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    local_d8.primitive_restart_enable = local_70.primitive_restart_enable;
    uVar8 = local_d8._16_8_;
    local_d8.logic_op = local_70.logic_op;
    local_d8.color_write_enable = local_70.color_write_enable;
    local_d8.depth_bias_enable = local_70.depth_bias_enable;
    local_d8.discard_rectangle = local_70.discard_rectangle;
    local_d8.discard_rectangle_mode = local_70.discard_rectangle_mode;
    local_d8.fragment_shading_rate = local_70.fragment_shading_rate;
    local_d8.sample_locations = local_70.sample_locations;
    local_d8.line_stipple = local_70.line_stipple;
    local_d8.stencil_compare = local_70.stencil_compare;
    local_d8.stencil_reference = local_70.stencil_reference;
    local_d8.stencil_write_mask = local_70.stencil_write_mask;
    local_d8.depth_bounds = local_70.depth_bounds;
    local_d8.depth_bias = local_70.depth_bias;
    local_d8.line_width = local_70.line_width;
    local_d8.blend_constants = local_70.blend_constants;
    local_d8.scissor = local_70.scissor;
    local_d8.viewport = local_70.viewport;
    local_d8.scissor_count = local_70.scissor_count;
    local_d8.viewport_count = local_70.viewport_count;
    local_d8.cull_mode = local_70.cull_mode;
    local_d8.front_face = local_70.front_face;
    local_d8.depth_test_enable = local_70.depth_test_enable;
    local_d8.depth_write_enable = local_70.depth_write_enable;
    local_d8.depth_compare_op = local_70.depth_compare_op;
    local_d8.vertex_input = local_70.vertex_input;
    local_d8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    bVar13 = local_d8.vertex_input;
    bVar9 = local_d8.rasterizer_discard_enable;
    local_d8._16_8_ = uVar8;
  }
  GVar16 = Hashing::parse_global_state_info
                     (create_info,(DynamicStateInfo *)(ulong)bVar13,(SubpassMeta *)(ulong)bVar9);
  uVar12 = GVar16._0_8_;
  uVar1 = info->flags;
  state_flags = 0xf;
  piVar14 = (int *)info->pNext;
  for (piVar3 = piVar14; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9fac02) {
      if ((uVar1 >> 0xb & 1) != 0) {
        state_flags = piVar3[4];
      }
      break;
    }
  }
  if (((undefined1  [11])GVar16 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  if ((uVar12 >> 0x30 & 1) == 0) {
    info->pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  }
  if ((uVar12 >> 0x20 & 1) == 0) {
    info->pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  }
  if ((uVar12 >> 0x28 & 1) == 0) {
    info->pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  uVar11 = GVar16._0_4_;
  if ((uVar11 >> 8 & 1) == 0) {
    info->pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  if ((uVar11 >> 0x10 & 1) == 0) {
    info->pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
  }
  if ((uVar11 >> 0x18 & 1) == 0) {
    info->pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  }
  if ((uVar12 >> 0x38 & 1) == 0) {
    info->pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar16 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->renderPass = (VkRenderPass)0x0;
    info->subpass = 0;
  }
  if ((GVar16._8_3_ >> 8 & 1) == 0) {
    info->layout = (VkPipelineLayout)0x0;
  }
  info->flags = uVar1 & 0x7ffffc3f;
  for (; piVar14 != (int *)0x0; piVar14 = *(int **)(piVar14 + 2)) {
    if (*piVar14 == 0x3ba1f5f5) {
      info->flags = 0;
      goto LAB_0012f397;
    }
  }
  if ((uVar1 & 4) == 0) {
LAB_0012f397:
    info->basePipelineHandle = (VkPipeline)0x0;
  }
  else if (info->basePipelineHandle == (VkPipeline)0x0) {
    uVar1 = info->basePipelineIndex;
    if (-1 < (long)(int)uVar1) {
      if (base_pipeline_count <= uVar1) {
        if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
          return false;
        }
        bVar10 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
        if (!bVar10) {
          copy_graphics_pipeline();
          return false;
        }
        return false;
      }
      info->basePipelineHandle = base_pipelines[(int)uVar1];
    }
  }
  info->basePipelineIndex = -1;
  bVar10 = copy_sub_create_info<VkPipelineTessellationStateCreateInfo>
                     (this,&info->pTessellationState,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  bVar10 = copy_sub_create_info<VkPipelineColorBlendStateCreateInfo>
                     (this,&info->pColorBlendState,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  local_80 = &info->pVertexInputState;
  bVar10 = copy_sub_create_info<VkPipelineVertexInputStateCreateInfo>
                     (this,local_80,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  local_88 = &info->pMultisampleState;
  bVar10 = copy_sub_create_info<VkPipelineMultisampleStateCreateInfo>
                     (this,local_88,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  local_90 = &info->pViewportState;
  bVar10 = copy_sub_create_info<VkPipelineViewportStateCreateInfo>
                     (this,local_90,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  bVar10 = copy_sub_create_info<VkPipelineInputAssemblyStateCreateInfo>
                     (this,&info->pInputAssemblyState,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  bVar10 = copy_sub_create_info<VkPipelineDepthStencilStateCreateInfo>
                     (this,&info->pDepthStencilState,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  bVar10 = copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
                     (this,&info->pRasterizationState,alloc,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  if ((GVar16._8_3_ >> 0x10 & 1) == 0) {
    info->stageCount = 0;
    info->pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  }
  else {
    bVar10 = copy_stages<VkGraphicsPipelineCreateInfo>(this,info,alloc,local_78,gsmcii,&local_d8);
    if (!bVar10) {
      return false;
    }
  }
  bVar10 = copy_dynamic_state<VkGraphicsPipelineCreateInfo>(this,info,alloc,&local_d8);
  if (!bVar10) {
    return false;
  }
  pVVar4 = info->pColorBlendState;
  if (pVVar4 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
    if (((local_d8.color_blend_enable == true) && (local_d8.color_write_mask == true)) &&
       (local_d8.color_blend_equation == true)) {
      pVVar4->pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
    }
    else {
      if ((ulong)pVVar4->attachmentCount == 0) {
LAB_0012f5e9:
        __dest = (VkPipelineColorBlendAttachmentState *)0x0;
      }
      else {
        __src = pVVar4->pAttachments;
        sVar15 = (ulong)pVVar4->attachmentCount << 5;
        __dest = (VkPipelineColorBlendAttachmentState *)
                 ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
        if (__dest == (VkPipelineColorBlendAttachmentState *)0x0) goto LAB_0012f5e9;
        memmove(__dest,__src,sVar15);
      }
      pVVar4->pAttachments = __dest;
    }
  }
  pVVar5 = *local_80;
  if (pVVar5 != (VkPipelineVertexInputStateCreateInfo *)0x0) {
    if ((ulong)pVVar5->vertexAttributeDescriptionCount == 0) {
LAB_0012f643:
      __dest_00 = (VkVertexInputAttributeDescription *)0x0;
    }
    else {
      __src_00 = pVVar5->pVertexAttributeDescriptions;
      sVar15 = (ulong)pVVar5->vertexAttributeDescriptionCount << 4;
      __dest_00 = (VkVertexInputAttributeDescription *)
                  ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
      if (__dest_00 == (VkVertexInputAttributeDescription *)0x0) goto LAB_0012f643;
      memmove(__dest_00,__src_00,sVar15);
    }
    pVVar5->pVertexAttributeDescriptions = __dest_00;
    if ((ulong)pVVar5->vertexBindingDescriptionCount == 0) {
LAB_0012f690:
      __dest_01 = (VkVertexInputBindingDescription *)0x0;
    }
    else {
      __src_01 = pVVar5->pVertexBindingDescriptions;
      sVar15 = (ulong)pVVar5->vertexBindingDescriptionCount * 0xc;
      __dest_01 = (VkVertexInputBindingDescription *)
                  ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
      if (__dest_01 == (VkVertexInputBindingDescription *)0x0) goto LAB_0012f690;
      memmove(__dest_01,__src_01,sVar15);
    }
    pVVar5->pVertexBindingDescriptions = __dest_01;
  }
  pVVar6 = *local_90;
  if (pVVar6 != (VkPipelineViewportStateCreateInfo *)0x0) {
    __src_02 = pVVar6->pViewports;
    if (__src_02 != (VkViewport *)0x0) {
      if ((ulong)pVVar6->viewportCount == 0) {
LAB_0012f6f0:
        __dest_02 = (VkViewport *)0x0;
      }
      else {
        sVar15 = (ulong)pVVar6->viewportCount * 0x18;
        __dest_02 = (VkViewport *)ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
        if (__dest_02 == (VkViewport *)0x0) goto LAB_0012f6f0;
        memmove(__dest_02,__src_02,sVar15);
      }
      pVVar6->pViewports = __dest_02;
    }
    __src_03 = pVVar6->pScissors;
    if (__src_03 != (VkRect2D *)0x0) {
      if ((ulong)pVVar6->scissorCount == 0) {
LAB_0012f73a:
        __dest_03 = (VkRect2D *)0x0;
      }
      else {
        sVar15 = (ulong)pVVar6->scissorCount << 4;
        __dest_03 = (VkRect2D *)ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
        if (__dest_03 == (VkRect2D *)0x0) goto LAB_0012f73a;
        memmove(__dest_03,__src_03,sVar15);
      }
      pVVar6->pScissors = __dest_03;
    }
  }
  pVVar7 = *local_88;
  if (pVVar7 == (VkPipelineMultisampleStateCreateInfo *)0x0) goto LAB_0012f7bc;
  if (local_d8.sample_mask == true) {
    pVVar7->pSampleMask = (VkSampleMask *)0x0;
    goto LAB_0012f7bc;
  }
  __src_04 = pVVar7->pSampleMask;
  if (__src_04 == (VkSampleMask *)0x0) goto LAB_0012f7bc;
  uVar1 = pVVar7->rasterizationSamples +
          (VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT
          |VK_SAMPLE_COUNT_2_BIT);
  if (uVar1 < 0x3f) {
LAB_0012f7b5:
    __dest_04 = (VkSampleMask *)0x0;
  }
  else {
    uVar11 = pVVar7->rasterizationSamples +
             (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
              VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
    if ((int)uVar11 < 0) {
      uVar11 = uVar1;
    }
    sVar15 = (long)((int)uVar11 >> 5) << 2;
    __dest_04 = (VkSampleMask *)ScratchAllocator::allocate_raw(alloc,sVar15,0x10);
    if (__dest_04 == (VkSampleMask *)0x0) goto LAB_0012f7b5;
    memmove(__dest_04,__src_04,sVar15);
  }
  pVVar7->pSampleMask = __dest_04;
LAB_0012f7bc:
  bVar10 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,&local_d8,state_flags);
  if (!bVar10) {
    return false;
  }
  *out_create_info = info;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_graphics_pipeline(const VkGraphicsPipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                 const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                 VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                 VkGraphicsPipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	// At the time of copy we don't really know the subpass meta state since the render pass is still being
	// parsed in a thread.
	// Assume that the subpass uses color or depth when copying.
	// This could in theory break if app passes pointer to invalid data while taking advantage of this
	// rule, but it has never happened so far ...
	const SubpassMeta subpass_meta = { true, true };

	DynamicStateInfo dynamic_info = {};
	if (create_info->pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*create_info->pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(*create_info, dynamic_info, subpass_meta);
	auto state_flags = graphics_pipeline_get_effective_state_flags(*info);

	// Remove pointers which a driver must ignore depending on other state.
	if (!global_info.input_assembly)
		info->pInputAssemblyState = nullptr;
	if (!global_info.vertex_input)
		info->pVertexInputState = nullptr;
	if (!global_info.depth_stencil_state)
		info->pDepthStencilState = nullptr;
	if (!global_info.color_blend_state)
		info->pColorBlendState = nullptr;
	if (!global_info.tessellation_state)
		info->pTessellationState = nullptr;
	if (!global_info.viewport_state)
		info->pViewportState = nullptr;
	if (!global_info.multisample_state)
		info->pMultisampleState = nullptr;
	if (!global_info.rasterization_state)
		info->pRasterizationState = nullptr;

	// If we can ignore render pass state, do just that.
	if (!global_info.render_pass_state)
	{
		info->renderPass = VK_NULL_HANDLE;
		info->subpass = 0;
	}

	if (!global_info.layout_state)
		info->layout = VK_NULL_HANDLE;

	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_sub_create_info(info->pTessellationState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pColorBlendState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pVertexInputState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pMultisampleState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pViewportState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pInputAssemblyState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pDepthStencilState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pRasterizationState, alloc, &dynamic_info, state_flags))
		return false;

	if (global_info.module_state)
	{
		if (!copy_stages(info, alloc, device, gsmcii, &dynamic_info))
			return false;
	}
	else
	{
		info->stageCount = 0;
		info->pStages = nullptr;
	}

	if (!copy_dynamic_state(info, alloc, &dynamic_info))
		return false;

	if (info->pColorBlendState)
	{
		auto &blend = const_cast<VkPipelineColorBlendStateCreateInfo &>(*info->pColorBlendState);

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
			blend.pAttachments = nullptr;
		else
			blend.pAttachments = copy(blend.pAttachments, blend.attachmentCount, alloc);
	}

	if (info->pVertexInputState)
	{
		auto &vs = const_cast<VkPipelineVertexInputStateCreateInfo &>(*info->pVertexInputState);
		vs.pVertexAttributeDescriptions = copy(vs.pVertexAttributeDescriptions, vs.vertexAttributeDescriptionCount, alloc);
		vs.pVertexBindingDescriptions = copy(vs.pVertexBindingDescriptions, vs.vertexBindingDescriptionCount, alloc);
	}

	if (info->pViewportState)
	{
		auto &vp = const_cast<VkPipelineViewportStateCreateInfo &>(*info->pViewportState);
		if (vp.pViewports)
			vp.pViewports = copy(vp.pViewports, vp.viewportCount, alloc);
		if (vp.pScissors)
			vp.pScissors = copy(vp.pScissors, vp.scissorCount, alloc);
	}

	if (info->pMultisampleState)
	{
		auto &ms = const_cast<VkPipelineMultisampleStateCreateInfo &>(*info->pMultisampleState);
		if (dynamic_info.sample_mask)
			ms.pSampleMask = nullptr;

		// If rasterizationSamples is dynamic, but not sample mask,
		// rasterizationSamples still provides the size of the sample mask array.
		if (ms.pSampleMask)
			ms.pSampleMask = copy(ms.pSampleMask, (ms.rasterizationSamples + 31) / 32, alloc);
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, &dynamic_info, state_flags))
		return false;

	*out_create_info = info;
	return true;
}